

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_fma_functor::binary_op_atan2>
               (float *ptr,float *ptr1,float *outptr,int size)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  float fVar70;
  undefined1 auVar71 [32];
  __m128 _outp_1;
  __m128 _b_1;
  __m128 _p_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_atan2 op;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_1;
  __m128 negative_mask_full_x_1;
  __m128 normal_result_1;
  __m128 pi_additions_1;
  __m128 negative_mask_y_1;
  __m128 negative_mask_x_1;
  __m128 normal_mode_1;
  __m128 not_equal_zero_y_1;
  __m128 not_equal_zero_x_1;
  __m128 magic_half_pi_2;
  __m128 magic_pi_1;
  __m128 magic_negative_zero_2;
  __m128 magic_zero_1;
  __m128 output_approx_1;
  __m128 fourth_power_of_input_approx_1;
  __m128 square_of_input_approx_1;
  __m128 input_approx_1;
  __m128 is_small_input_1;
  __m128 absolute_1;
  __m128 negative_mask_1;
  __m128 magic_a8_1;
  __m128 magic_a7_1;
  __m128 magic_a6_1;
  __m128 magic_a5_1;
  __m128 magic_a4_1;
  __m128 magic_a3_1;
  __m128 magic_a2_1;
  __m128 magic_a1_1;
  __m128 magic_a0_1;
  __m128 magic_half_pi_3;
  __m128 magic_negative_one_1;
  __m128 magic_one_1;
  __m128 magic_negative_zero_3;
  undefined8 local_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 local_23f0;
  undefined8 uStack_23e8;
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  int local_2374;
  undefined1 local_236d;
  int local_236c;
  float *local_2368;
  undefined1 (*local_2360) [32];
  undefined1 (*local_2358) [32];
  undefined1 (*local_2350) [32];
  undefined1 (*local_2348) [32];
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  float *local_2318;
  undefined1 (*local_2310) [32];
  undefined1 (*local_2308) [32];
  undefined8 local_2300;
  undefined8 uStack_22f8;
  float *local_22f0;
  undefined8 *local_22e8;
  undefined8 *local_22e0;
  undefined1 *local_22d8;
  undefined8 *local_22d0;
  undefined8 *local_22c8;
  undefined1 *local_22c0;
  undefined1 (*local_22b8) [32];
  undefined1 (*local_22b0) [32];
  undefined1 *local_22a8;
  undefined1 local_22a0 [32];
  undefined1 local_2280 [32];
  float local_2260;
  float fStack_225c;
  float fStack_2258;
  float fStack_2254;
  float fStack_2250;
  float fStack_224c;
  float fStack_2248;
  float fStack_2244;
  undefined1 local_2240 [32];
  undefined1 local_2220 [32];
  undefined1 local_2200 [32];
  undefined1 local_21e0 [32];
  undefined1 local_21c0 [32];
  undefined1 local_21a0 [32];
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined1 local_20a0 [8];
  float fStack_2098;
  float fStack_2094;
  float fStack_2090;
  float fStack_208c;
  float fStack_2088;
  float fStack_2084;
  undefined4 local_2070;
  undefined4 local_206c;
  undefined4 local_2068;
  undefined4 local_2064;
  undefined1 local_2060 [16];
  undefined1 auStack_2050 [16];
  undefined4 local_2040;
  undefined4 local_203c;
  undefined4 local_2038;
  undefined4 local_2034;
  undefined4 local_2030;
  undefined4 local_202c;
  undefined4 local_2028;
  undefined4 local_2024;
  undefined1 local_2020 [16];
  undefined1 auStack_2010 [16];
  undefined4 local_2000;
  undefined4 local_1ffc;
  undefined4 local_1ff8;
  undefined4 local_1ff4;
  undefined4 local_1ff0;
  undefined4 local_1fec;
  undefined4 local_1fe8;
  undefined4 local_1fe4;
  undefined1 local_1fe0 [16];
  undefined1 auStack_1fd0 [16];
  undefined4 local_1fc0;
  undefined4 local_1fbc;
  undefined4 local_1fb8;
  undefined4 local_1fb4;
  undefined4 local_1fb0;
  undefined4 local_1fac;
  undefined4 local_1fa8;
  undefined4 local_1fa4;
  undefined1 local_1fa0 [16];
  undefined1 auStack_1f90 [16];
  undefined4 local_1f80;
  undefined4 local_1f7c;
  undefined4 local_1f78;
  undefined4 local_1f74;
  undefined4 local_1f70;
  undefined4 local_1f6c;
  undefined4 local_1f68;
  undefined4 local_1f64;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined1 local_1ea0 [32];
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [32];
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined1 local_1e00 [32];
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined1 local_1d20 [32];
  undefined1 local_1d00 [32];
  undefined1 local_1ce0 [32];
  undefined1 local_1cc0 [32];
  undefined1 local_1ca0 [32];
  undefined1 local_1c80 [32];
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined1 local_1bc0 [32];
  undefined1 local_1ba0 [32];
  undefined1 local_1b80 [32];
  undefined1 local_1b60 [32];
  undefined1 local_1b40 [32];
  undefined1 local_1b20 [32];
  undefined1 local_1b00 [32];
  undefined1 local_1ae0 [32];
  undefined1 local_1ac0 [32];
  float local_1aa0;
  float fStack_1a9c;
  float fStack_1a98;
  float fStack_1a94;
  float fStack_1a90;
  float fStack_1a8c;
  float fStack_1a88;
  float fStack_1a84;
  float local_1a80;
  float fStack_1a7c;
  float fStack_1a78;
  float fStack_1a74;
  float fStack_1a70;
  float fStack_1a6c;
  float fStack_1a68;
  float fStack_1a64;
  undefined1 local_1a60 [32];
  undefined1 local_1a40 [32];
  undefined1 local_1a20 [32];
  undefined1 local_1a00 [32];
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined1 local_1840 [32];
  undefined1 local_1820 [8];
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  float fStack_1804;
  float local_1800;
  float fStack_17fc;
  float fStack_17f8;
  float fStack_17f4;
  float fStack_17f0;
  float fStack_17ec;
  float fStack_17e8;
  float fStack_17e4;
  undefined4 local_17d4;
  undefined4 local_17d0;
  undefined4 local_17cc;
  undefined4 local_17c8;
  undefined4 local_17c4;
  undefined4 local_17c0;
  undefined4 local_17bc;
  undefined4 local_17b8;
  undefined4 local_17b4;
  undefined4 local_17b0;
  undefined4 local_17ac;
  undefined4 local_17a8;
  undefined4 local_17a4;
  undefined1 local_17a0 [16];
  undefined1 auStack_1790 [16];
  undefined4 local_1780;
  undefined4 local_177c;
  undefined4 local_1778;
  undefined4 local_1774;
  undefined4 local_1770;
  undefined4 local_176c;
  undefined4 local_1768;
  undefined4 local_1764;
  undefined1 local_1760 [16];
  undefined1 auStack_1750 [16];
  undefined4 local_1740;
  undefined4 local_173c;
  undefined4 local_1738;
  undefined4 local_1734;
  undefined4 local_1730;
  undefined4 local_172c;
  undefined4 local_1728;
  undefined4 local_1724;
  undefined1 local_1720 [16];
  undefined1 auStack_1710 [16];
  undefined4 local_1700;
  undefined4 local_16fc;
  undefined4 local_16f8;
  undefined4 local_16f4;
  undefined4 local_16f0;
  undefined4 local_16ec;
  undefined4 local_16e8;
  undefined4 local_16e4;
  undefined1 local_16e0 [16];
  undefined1 auStack_16d0 [16];
  undefined4 local_16c0;
  undefined4 local_16bc;
  undefined4 local_16b8;
  undefined4 local_16b4;
  undefined4 local_16b0;
  undefined4 local_16ac;
  undefined4 local_16a8;
  undefined4 local_16a4;
  undefined1 local_16a0 [16];
  undefined1 auStack_1690 [16];
  undefined4 local_1680;
  undefined4 local_167c;
  undefined4 local_1678;
  undefined4 local_1674;
  undefined4 local_1670;
  undefined4 local_166c;
  undefined4 local_1668;
  undefined4 local_1664;
  undefined1 local_1660 [16];
  undefined1 auStack_1650 [16];
  undefined4 local_1640;
  undefined4 local_163c;
  undefined4 local_1638;
  undefined4 local_1634;
  undefined4 local_1630;
  undefined4 local_162c;
  undefined4 local_1628;
  undefined4 local_1624;
  undefined1 local_1620 [16];
  undefined1 auStack_1610 [16];
  undefined4 local_1600;
  undefined4 local_15fc;
  undefined4 local_15f8;
  undefined4 local_15f4;
  undefined4 local_15f0;
  undefined4 local_15ec;
  undefined4 local_15e8;
  undefined4 local_15e4;
  undefined1 local_15e0 [16];
  undefined1 auStack_15d0 [16];
  undefined4 local_15c0;
  undefined4 local_15bc;
  undefined4 local_15b8;
  undefined4 local_15b4;
  undefined4 local_15b0;
  undefined4 local_15ac;
  undefined4 local_15a8;
  undefined4 local_15a4;
  undefined1 local_15a0 [16];
  undefined1 auStack_1590 [16];
  undefined4 local_1580;
  undefined4 local_157c;
  undefined4 local_1578;
  undefined4 local_1574;
  undefined4 local_1570;
  undefined4 local_156c;
  undefined4 local_1568;
  undefined4 local_1564;
  undefined1 local_1560 [16];
  undefined1 auStack_1550 [16];
  undefined4 local_1540;
  undefined4 local_153c;
  undefined4 local_1538;
  undefined4 local_1534;
  undefined4 local_1530;
  undefined4 local_152c;
  undefined4 local_1528;
  undefined4 local_1524;
  undefined1 local_1520 [16];
  undefined1 auStack_1510 [16];
  undefined4 local_1500;
  undefined4 local_14fc;
  undefined4 local_14f8;
  undefined4 local_14f4;
  undefined4 local_14f0;
  undefined4 local_14ec;
  undefined4 local_14e8;
  undefined4 local_14e4;
  undefined1 local_14e0 [16];
  undefined1 auStack_14d0 [16];
  undefined4 local_14c0;
  undefined4 local_14bc;
  undefined4 local_14b8;
  undefined4 local_14b4;
  undefined4 local_14b0;
  undefined4 local_14ac;
  undefined4 local_14a8;
  undefined4 local_14a4;
  undefined1 local_14a0 [16];
  undefined1 auStack_1490 [16];
  undefined4 local_1480;
  undefined4 local_147c;
  undefined4 local_1478;
  undefined4 local_1474;
  undefined4 local_1470;
  undefined4 local_146c;
  undefined4 local_1468;
  undefined4 local_1464;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 *local_1360;
  undefined1 *local_1358;
  float *local_1350;
  undefined8 *local_1348;
  undefined1 *local_1340;
  float *local_1338;
  undefined8 *local_1330;
  undefined1 *local_1328;
  float *local_1320;
  undefined8 *local_1318;
  undefined1 *local_1310;
  float *local_1308;
  undefined8 *local_1300;
  undefined8 *local_12f8;
  float *local_12f0;
  undefined8 *local_12e8;
  undefined1 *local_12e0;
  float *local_12d8;
  undefined8 *local_12d0;
  undefined1 *local_12c8;
  float *local_12c0;
  undefined8 *local_12b8;
  undefined8 *local_12b0;
  float *local_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  float local_e80;
  float fStack_e7c;
  float fStack_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float fStack_e68;
  float fStack_e64;
  undefined1 local_e60 [32];
  undefined1 local_e40 [32];
  undefined1 local_e20 [32];
  undefined1 local_e00 [32];
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined1 local_ce0 [32];
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined1 local_c60 [16];
  undefined1 local_c50 [16];
  float local_c40;
  float fStack_c3c;
  float fStack_c38;
  float fStack_c34;
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  undefined1 local_be0 [16];
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined1 local_af0 [16];
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined1 local_aa0 [16];
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined1 local_980 [16];
  undefined8 local_970;
  undefined8 uStack_968;
  undefined1 local_960 [16];
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined4 local_904;
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 local_8c8;
  undefined4 local_8c4;
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 local_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined1 local_840 [16];
  undefined1 local_830 [16];
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined1 local_690 [16];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float local_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined1 *local_560;
  undefined1 *local_558;
  float *local_550;
  undefined8 *local_548;
  undefined1 *local_540;
  float *local_538;
  undefined8 *local_530;
  undefined1 *local_528;
  float *local_520;
  undefined8 *local_518;
  undefined1 *local_510;
  float *local_508;
  undefined8 *local_500;
  undefined8 *local_4f8;
  float *local_4f0;
  undefined8 *local_4e8;
  undefined1 *local_4e0;
  float *local_4d8;
  undefined8 *local_4d0;
  undefined1 *local_4c8;
  float *local_4c0;
  undefined8 *local_4b8;
  undefined8 *local_4b0;
  float *local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  float local_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_f4;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined1 local_70 [16];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_2368 = in_RDX;
  local_2360 = in_RSI;
  local_2358 = in_RDI;
  for (local_2374 = 0; local_2374 + 7 < in_ECX; local_2374 = local_2374 + 8) {
    local_2348 = local_2358;
    local_23a0 = *(undefined8 *)*local_2358;
    uStack_2398 = *(undefined8 *)(*local_2358 + 8);
    uStack_2390 = *(undefined8 *)(*local_2358 + 0x10);
    uStack_2388 = *(undefined8 *)(*local_2358 + 0x18);
    local_2350 = local_2360;
    local_23c0 = *(undefined8 *)*local_2360;
    uStack_23b8 = *(undefined8 *)(*local_2360 + 8);
    uStack_23b0 = *(undefined8 *)(*local_2360 + 0x10);
    uStack_23a8 = *(undefined8 *)(*local_2360 + 0x18);
    local_22d8 = &local_236d;
    local_22e0 = &local_23a0;
    local_22e8 = &local_23c0;
    local_2064 = 0;
    local_2040 = 0;
    auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
    local_2060 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
    auStack_2050 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
    local_2120 = local_2060._0_8_;
    uStack_2118 = local_2060._8_8_;
    uStack_2110 = auStack_2050._0_8_;
    uStack_2108 = auStack_2050._8_8_;
    local_2068 = 0x80000000;
    local_2000 = 0x80000000;
    auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
    local_2020 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
    auStack_2010 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
    local_2140 = local_2020._0_8_;
    uStack_2138 = local_2020._8_8_;
    uStack_2130 = auStack_2010._0_8_;
    uStack_2128 = auStack_2010._8_8_;
    local_206c = 0x40490fdb;
    local_1fc0 = 0x40490fdb;
    auVar2 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x20);
    local_1fe0 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x20);
    auStack_1fd0 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x30);
    local_2160 = local_1fe0._0_8_;
    uStack_2158 = local_1fe0._8_8_;
    uStack_2150 = auStack_1fd0._0_8_;
    uStack_2148 = auStack_1fd0._8_8_;
    local_2070 = 0x3fc90fdb;
    local_1f80 = 0x3fc90fdb;
    auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
    local_1fa0 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
    auStack_1f90 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
    local_2180 = local_1fa0._0_8_;
    uStack_2178 = local_1fa0._8_8_;
    uStack_2170 = auStack_1f90._0_8_;
    uStack_2168 = auStack_1f90._8_8_;
    auVar1._16_8_ = auStack_2050._0_8_;
    auVar1._0_16_ = local_2060;
    auVar1._24_8_ = auStack_2050._8_8_;
    local_21a0 = vcmpps_avx(*local_2360,auVar1,4);
    auVar3._16_8_ = auStack_2050._0_8_;
    auVar3._0_16_ = local_2060;
    auVar3._24_8_ = auStack_2050._8_8_;
    local_21c0 = vcmpps_avx(*local_2358,auVar3,4);
    local_1d40 = local_21a0._0_8_;
    uStack_1d38 = local_21a0._8_8_;
    uStack_1d30 = local_21a0._16_8_;
    uStack_1d28 = local_21a0._24_8_;
    local_1d60 = local_21c0._0_8_;
    uStack_1d58 = local_21c0._8_8_;
    uStack_1d50 = local_21c0._16_8_;
    uStack_1d48 = local_21c0._24_8_;
    local_21e0 = vandps_avx(local_21a0,local_21c0);
    local_1d80 = local_2020._0_8_;
    uStack_1d78 = local_2020._8_8_;
    uStack_1d70 = auStack_2010._0_8_;
    uStack_1d68 = auStack_2010._8_8_;
    auVar17._16_8_ = auStack_2010._0_8_;
    auVar17._0_16_ = local_2020;
    auVar17._24_8_ = auStack_2010._8_8_;
    local_2200 = vandps_avx(auVar17,*local_2360);
    local_1dc0 = local_2020._0_8_;
    uStack_1db8 = local_2020._8_8_;
    uStack_1db0 = auStack_2010._0_8_;
    uStack_1da8 = auStack_2010._8_8_;
    auVar16._16_8_ = auStack_2010._0_8_;
    auVar16._0_16_ = local_2020;
    auVar16._24_8_ = auStack_2010._8_8_;
    local_2220 = vandps_avx(auVar16,*local_2358);
    auVar11._16_8_ = auStack_2050._0_8_;
    auVar11._0_16_ = local_2060;
    auVar11._24_8_ = auStack_2050._8_8_;
    local_1e40 = vcmpps_avx(*local_2360,auVar11,1);
    local_1e00 = vcmpps_avx(*local_2358,auVar11,1);
    local_1e20 = local_2020._0_8_;
    uStack_1e18 = local_2020._8_8_;
    uStack_1e10 = auStack_2010._0_8_;
    uStack_1e08 = auStack_2010._8_8_;
    auVar15._16_8_ = auStack_2010._0_8_;
    auVar15._0_16_ = local_2020;
    auVar15._24_8_ = auStack_2010._8_8_;
    local_1bc0 = vandps_avx(local_1e00,auVar15);
    local_1be0 = local_1fe0._0_8_;
    uStack_1bd8 = local_1fe0._8_8_;
    uStack_1bd0 = auStack_1fd0._0_8_;
    uStack_1bc8 = auStack_1fd0._8_8_;
    auVar20._16_8_ = auStack_1fd0._0_8_;
    auVar20._0_16_ = local_1fe0;
    auVar20._24_8_ = auStack_1fd0._8_8_;
    local_1e60 = vorps_avx(local_1bc0,auVar20);
    local_2240 = vandps_avx(local_1e40,local_1e60);
    local_1840 = vdivps_avx(*local_2358,*local_2360);
    local_17a4 = 0x80000000;
    local_1780 = 0x80000000;
    auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
    local_17a0 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
    auStack_1790 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
    local_1860 = local_17a0._0_8_;
    uStack_1858 = local_17a0._8_8_;
    uStack_1850 = auStack_1790._0_8_;
    uStack_1848 = auStack_1790._8_8_;
    local_17a8 = 0x3f800000;
    local_1740 = 0x3f800000;
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    local_1760 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    auStack_1750 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    local_1880 = local_1760._0_8_;
    uStack_1878 = local_1760._8_8_;
    uStack_1870 = auStack_1750._0_8_;
    uStack_1868 = auStack_1750._8_8_;
    local_17ac = 0xbf800000;
    local_1700 = 0xbf800000;
    auVar2 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x20);
    local_1720 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x20);
    auStack_1710 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x30);
    local_18a0 = local_1720._0_8_;
    uStack_1898 = local_1720._8_8_;
    uStack_1890 = auStack_1710._0_8_;
    uStack_1888 = auStack_1710._8_8_;
    local_17b0 = 0x3fc90fdb;
    local_16c0 = 0x3fc90fdb;
    auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
    local_16e0 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
    auStack_16d0 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
    local_18c0 = local_16e0._0_8_;
    uStack_18b8 = local_16e0._8_8_;
    uStack_18b0 = auStack_16d0._0_8_;
    uStack_18a8 = auStack_16d0._8_8_;
    local_17b4 = 0x3f800000;
    local_1680 = 0x3f800000;
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    local_16a0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    auStack_1690 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    local_18e0 = local_16a0._0_8_;
    uStack_18d8 = local_16a0._8_8_;
    uStack_18d0 = auStack_1690._0_8_;
    uStack_18c8 = auStack_1690._8_8_;
    local_17b8 = 0xbeaaaa53;
    local_1640 = 0xbeaaaa53;
    auVar2 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x20);
    local_1660 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x20);
    auStack_1650 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x30);
    local_1900 = local_1660._0_8_;
    uStack_18f8 = local_1660._8_8_;
    uStack_18f0 = auStack_1650._0_8_;
    uStack_18e8 = auStack_1650._8_8_;
    local_17bc = 0x3e4cb974;
    local_1600 = 0x3e4cb974;
    auVar2 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x20);
    local_1620 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x20);
    auStack_1610 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x30);
    local_1920 = local_1620._0_8_;
    uStack_1918 = local_1620._8_8_;
    uStack_1910 = auStack_1610._0_8_;
    uStack_1908 = auStack_1610._8_8_;
    local_17c0 = 0xbe117200;
    local_15c0 = 0xbe117200;
    auVar2 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x20);
    local_15e0 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x20);
    auStack_15d0 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x30);
    local_1940 = local_15e0._0_8_;
    uStack_1938 = local_15e0._8_8_;
    uStack_1930 = auStack_15d0._0_8_;
    uStack_1928 = auStack_15d0._8_8_;
    local_17c4 = 0x3dd9ed24;
    local_1580 = 0x3dd9ed24;
    auVar2 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x20);
    local_15a0 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x20);
    auStack_1590 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x30);
    local_1960 = local_15a0._0_8_;
    uStack_1958 = local_15a0._8_8_;
    uStack_1950 = auStack_1590._0_8_;
    uStack_1948 = auStack_1590._8_8_;
    local_17c8 = 0xbd99b01e;
    local_1540 = 0xbd99b01e;
    auVar2 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x20);
    local_1560 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x20);
    auStack_1550 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x30);
    local_1980 = local_1560._0_8_;
    uStack_1978 = local_1560._8_8_;
    uStack_1970 = auStack_1550._0_8_;
    uStack_1968 = auStack_1550._8_8_;
    local_17cc = 0x3d2edd4e;
    local_1500 = 0x3d2edd4e;
    auVar2 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x20);
    local_1520 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x20);
    auStack_1510 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x30);
    local_19a0 = local_1520._0_8_;
    uStack_1998 = local_1520._8_8_;
    uStack_1990 = auStack_1510._0_8_;
    uStack_1988 = auStack_1510._8_8_;
    local_17d0 = 0xbc83a25c;
    local_14c0 = 0xbc83a25c;
    auVar2 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x20);
    local_14e0 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x20);
    auStack_14d0 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x30);
    local_19c0 = local_14e0._0_8_;
    uStack_19b8 = local_14e0._8_8_;
    uStack_19b0 = auStack_14d0._0_8_;
    uStack_19a8 = auStack_14d0._8_8_;
    local_17d4 = 0x3b3ac537;
    local_1480 = 0x3b3ac537;
    auVar2 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x20);
    local_14a0 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x20);
    auStack_1490 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x30);
    local_19e0 = local_14a0._0_8_;
    uStack_19d8 = local_14a0._8_8_;
    uStack_19d0 = auStack_1490._0_8_;
    uStack_19c8 = auStack_1490._8_8_;
    local_11c0 = local_17a0._0_8_;
    uStack_11b8 = local_17a0._8_8_;
    uStack_11b0 = auStack_1790._0_8_;
    uStack_11a8 = auStack_1790._8_8_;
    local_11e0 = local_1840._0_8_;
    uStack_11d8 = local_1840._8_8_;
    uStack_11d0 = local_1840._16_8_;
    uStack_11c8 = local_1840._24_8_;
    auVar24._16_8_ = auStack_1790._0_8_;
    auVar24._0_16_ = local_17a0;
    auVar24._24_8_ = auStack_1790._8_8_;
    local_1a00 = vandps_avx(auVar24,local_1840);
    local_d40 = local_17a0._0_8_;
    uStack_d38 = local_17a0._8_8_;
    uStack_d30 = auStack_1790._0_8_;
    uStack_d28 = auStack_1790._8_8_;
    local_d60 = local_1840._0_8_;
    uStack_d58 = local_1840._8_8_;
    uStack_d50 = local_1840._16_8_;
    uStack_d48 = local_1840._24_8_;
    auVar27._16_8_ = auStack_1790._0_8_;
    auVar27._0_16_ = local_17a0;
    auVar27._24_8_ = auStack_1790._8_8_;
    auVar1 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
    local_1a20 = vandnps_avx(auVar27,local_1840);
    auVar21._16_8_ = auStack_1750._0_8_;
    auVar21._0_16_ = local_1760;
    auVar21._24_8_ = auStack_1750._8_8_;
    local_1a40 = vcmpps_avx(auVar21,local_1a20,1);
    local_1200 = local_1a40._0_8_;
    uStack_11f8 = local_1a40._8_8_;
    uStack_11f0 = local_1a40._16_8_;
    uStack_11e8 = local_1a40._24_8_;
    local_1220 = local_1720._0_8_;
    uStack_1218 = local_1720._8_8_;
    uStack_1210 = auStack_1710._0_8_;
    uStack_1208 = auStack_1710._8_8_;
    auVar23._16_8_ = auStack_1710._0_8_;
    auVar23._0_16_ = local_1720;
    auVar23._24_8_ = auStack_1710._8_8_;
    local_e00 = vandps_avx(local_1a40,auVar23);
    local_d80 = local_1a40._0_8_;
    uStack_d78 = local_1a40._8_8_;
    uStack_d70 = local_1a40._16_8_;
    uStack_d68 = local_1a40._24_8_;
    local_da0 = local_1a20._0_8_;
    uStack_d98 = local_1a20._8_8_;
    uStack_d90 = local_1a20._16_8_;
    uStack_d88 = local_1a20._24_8_;
    local_e20 = vandnps_avx(local_1a40,local_1a20);
    local_1380 = vorps_avx(local_e00,local_e20);
    local_1240 = local_1a40._0_8_;
    uStack_1238 = local_1a40._8_8_;
    uStack_1230 = local_1a40._16_8_;
    uStack_1228 = local_1a40._24_8_;
    local_1260 = local_1a20._0_8_;
    uStack_1258 = local_1a20._8_8_;
    uStack_1250 = local_1a20._16_8_;
    uStack_1248 = local_1a20._24_8_;
    local_e40 = vandps_avx(local_1a40,local_1a20);
    local_dc0 = local_1a40._0_8_;
    uStack_db8 = local_1a40._8_8_;
    uStack_db0 = local_1a40._16_8_;
    uStack_da8 = local_1a40._24_8_;
    local_de0 = local_1760._0_8_;
    uStack_dd8 = local_1760._8_8_;
    uStack_dd0 = auStack_1750._0_8_;
    uStack_dc8 = auStack_1750._8_8_;
    auVar26._16_8_ = auStack_1750._0_8_;
    auVar26._0_16_ = local_1760;
    auVar26._24_8_ = auStack_1750._8_8_;
    local_e60 = vandnps_avx(local_1a40,auVar26);
    local_13a0 = vorps_avx(local_e40,local_e60);
    local_1a60 = vdivps_avx(local_1380,local_13a0);
    local_13e0 = local_1a60._0_8_;
    uStack_13d8 = local_1a60._8_8_;
    uStack_13d0 = local_1a60._16_8_;
    uStack_13c8 = local_1a60._24_8_;
    local_13c0._0_4_ = local_1a60._0_4_;
    local_13c0._4_4_ = local_1a60._4_4_;
    uStack_13b8._0_4_ = local_1a60._8_4_;
    uStack_13b8._4_4_ = local_1a60._12_4_;
    uStack_13b0._0_4_ = local_1a60._16_4_;
    uStack_13b0._4_4_ = local_1a60._20_4_;
    uStack_13a8._0_4_ = local_1a60._24_4_;
    uStack_13a8._4_4_ = local_1a60._28_4_;
    fStack_1a64 = uStack_13a8._4_4_;
    local_1a80 = (float)local_13c0 * (float)local_13c0;
    fStack_1a7c = local_13c0._4_4_ * local_13c0._4_4_;
    fStack_1a78 = (float)uStack_13b8 * (float)uStack_13b8;
    fStack_1a74 = uStack_13b8._4_4_ * uStack_13b8._4_4_;
    fStack_1a70 = (float)uStack_13b0 * (float)uStack_13b0;
    fStack_1a6c = uStack_13b0._4_4_ * uStack_13b0._4_4_;
    fStack_1a68 = (float)uStack_13a8 * (float)uStack_13a8;
    local_1420 = CONCAT44(fStack_1a7c,local_1a80);
    uStack_1418 = CONCAT44(fStack_1a74,fStack_1a78);
    uStack_1410 = CONCAT44(fStack_1a6c,fStack_1a70);
    uStack_1408 = CONCAT44(uStack_13a8._4_4_,fStack_1a68);
    fStack_1a84 = uStack_13a8._4_4_;
    local_1aa0 = local_1a80 * local_1a80;
    fStack_1a9c = fStack_1a7c * fStack_1a7c;
    fStack_1a98 = fStack_1a78 * fStack_1a78;
    fStack_1a94 = fStack_1a74 * fStack_1a74;
    fStack_1a90 = fStack_1a70 * fStack_1a70;
    fStack_1a8c = fStack_1a6c * fStack_1a6c;
    fStack_1a88 = fStack_1a68 * fStack_1a68;
    local_1338 = &local_1aa0;
    local_12b0 = &local_19c0;
    local_12b8 = &local_1980;
    local_1160 = CONCAT44(fStack_1a9c,local_1aa0);
    uStack_1158 = CONCAT44(fStack_1a94,fStack_1a98);
    uStack_1150 = CONCAT44(fStack_1a8c,fStack_1a90);
    uStack_1148 = CONCAT44(uStack_13a8._4_4_,fStack_1a88);
    auVar36._4_4_ = fStack_1a9c;
    auVar36._0_4_ = local_1aa0;
    auVar36._8_4_ = fStack_1a98;
    auVar36._12_4_ = fStack_1a94;
    auVar36._16_4_ = fStack_1a90;
    auVar36._20_4_ = fStack_1a8c;
    auVar36._24_4_ = fStack_1a88;
    auVar36._28_4_ = uStack_13a8._4_4_;
    local_1180 = local_14e0._0_8_;
    uStack_1178 = local_14e0._8_8_;
    uStack_1170 = auStack_14d0._0_8_;
    uStack_1168 = auStack_14d0._8_8_;
    auVar45._16_8_ = auStack_14d0._0_8_;
    auVar45._0_16_ = local_14e0;
    auVar45._24_8_ = auStack_14d0._8_8_;
    local_11a0 = local_1560._0_8_;
    uStack_1198 = local_1560._8_8_;
    uStack_1190 = auStack_1550._0_8_;
    uStack_1188 = auStack_1550._8_8_;
    auVar47._16_8_ = auStack_1550._0_8_;
    auVar47._0_16_ = local_1560;
    auVar47._24_8_ = auStack_1550._8_8_;
    auVar2 = vfmadd213ps_fma(auVar45,auVar36,auVar47);
    local_12c8 = local_1b20;
    local_12d0 = &local_1940;
    local_1100 = CONCAT44(fStack_1a9c,local_1aa0);
    uStack_10f8 = CONCAT44(fStack_1a94,fStack_1a98);
    uStack_10f0 = CONCAT44(fStack_1a8c,fStack_1a90);
    uStack_10e8 = CONCAT44(uStack_13a8._4_4_,fStack_1a88);
    auVar37._4_4_ = fStack_1a9c;
    auVar37._0_4_ = local_1aa0;
    auVar37._8_4_ = fStack_1a98;
    auVar37._12_4_ = fStack_1a94;
    auVar37._16_4_ = fStack_1a90;
    auVar37._20_4_ = fStack_1a8c;
    auVar37._24_4_ = fStack_1a88;
    auVar37._28_4_ = uStack_13a8._4_4_;
    local_1b20._0_8_ = auVar2._0_8_;
    local_1120 = local_1b20._0_8_;
    local_1b20._8_8_ = auVar2._8_8_;
    uStack_1118 = local_1b20._8_8_;
    uStack_1110 = 0;
    uStack_1108 = 0;
    local_1140 = local_15e0._0_8_;
    uStack_1138 = local_15e0._8_8_;
    uStack_1130 = auStack_15d0._0_8_;
    uStack_1128 = auStack_15d0._8_8_;
    auVar49._16_8_ = auStack_15d0._0_8_;
    auVar49._0_16_ = local_15e0;
    auVar49._24_8_ = auStack_15d0._8_8_;
    auVar4 = vfmadd213ps_fma(ZEXT1632(auVar2),auVar37,auVar49);
    local_12e0 = local_1b00;
    local_12e8 = &local_1900;
    local_10a0 = CONCAT44(fStack_1a9c,local_1aa0);
    uStack_1098 = CONCAT44(fStack_1a94,fStack_1a98);
    uStack_1090 = CONCAT44(fStack_1a8c,fStack_1a90);
    uStack_1088 = CONCAT44(uStack_13a8._4_4_,fStack_1a88);
    auVar38._4_4_ = fStack_1a9c;
    auVar38._0_4_ = local_1aa0;
    auVar38._8_4_ = fStack_1a98;
    auVar38._12_4_ = fStack_1a94;
    auVar38._16_4_ = fStack_1a90;
    auVar38._20_4_ = fStack_1a8c;
    auVar38._24_4_ = fStack_1a88;
    auVar38._28_4_ = uStack_13a8._4_4_;
    local_1b00._0_8_ = auVar4._0_8_;
    local_10c0 = local_1b00._0_8_;
    local_1b00._8_8_ = auVar4._8_8_;
    uStack_10b8 = local_1b00._8_8_;
    uStack_10b0 = 0;
    uStack_10a8 = 0;
    local_10e0 = local_1660._0_8_;
    uStack_10d8 = local_1660._8_8_;
    uStack_10d0 = auStack_1650._0_8_;
    uStack_10c8 = auStack_1650._8_8_;
    auVar51._16_8_ = auStack_1650._0_8_;
    auVar51._0_16_ = local_1660;
    auVar51._24_8_ = auStack_1650._8_8_;
    auVar5 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar38,auVar51);
    local_12f8 = &local_19e0;
    local_1300 = &local_19a0;
    local_1040 = CONCAT44(fStack_1a9c,local_1aa0);
    uStack_1038 = CONCAT44(fStack_1a94,fStack_1a98);
    uStack_1030 = CONCAT44(fStack_1a8c,fStack_1a90);
    uStack_1028 = CONCAT44(uStack_13a8._4_4_,fStack_1a88);
    auVar39._4_4_ = fStack_1a9c;
    auVar39._0_4_ = local_1aa0;
    auVar39._8_4_ = fStack_1a98;
    auVar39._12_4_ = fStack_1a94;
    auVar39._16_4_ = fStack_1a90;
    auVar39._20_4_ = fStack_1a8c;
    auVar39._24_4_ = fStack_1a88;
    auVar39._28_4_ = uStack_13a8._4_4_;
    local_1060 = local_14a0._0_8_;
    uStack_1058 = local_14a0._8_8_;
    uStack_1050 = auStack_1490._0_8_;
    uStack_1048 = auStack_1490._8_8_;
    auVar44._16_8_ = auStack_1490._0_8_;
    auVar44._0_16_ = local_14a0;
    auVar44._24_8_ = auStack_1490._8_8_;
    local_1080 = local_1520._0_8_;
    uStack_1078 = local_1520._8_8_;
    uStack_1070 = auStack_1510._0_8_;
    uStack_1068 = auStack_1510._8_8_;
    auVar46._16_8_ = auStack_1510._0_8_;
    auVar46._0_16_ = local_1520;
    auVar46._24_8_ = auStack_1510._8_8_;
    auVar6 = vfmadd213ps_fma(auVar44,auVar39,auVar46);
    local_1310 = local_1ba0;
    local_1318 = &local_1960;
    local_fe0 = CONCAT44(fStack_1a9c,local_1aa0);
    uStack_fd8 = CONCAT44(fStack_1a94,fStack_1a98);
    uStack_fd0 = CONCAT44(fStack_1a8c,fStack_1a90);
    uStack_fc8 = CONCAT44(uStack_13a8._4_4_,fStack_1a88);
    auVar40._4_4_ = fStack_1a9c;
    auVar40._0_4_ = local_1aa0;
    auVar40._8_4_ = fStack_1a98;
    auVar40._12_4_ = fStack_1a94;
    auVar40._16_4_ = fStack_1a90;
    auVar40._20_4_ = fStack_1a8c;
    auVar40._24_4_ = fStack_1a88;
    auVar40._28_4_ = uStack_13a8._4_4_;
    local_1ba0._0_8_ = auVar6._0_8_;
    local_1000 = local_1ba0._0_8_;
    local_1ba0._8_8_ = auVar6._8_8_;
    uStack_ff8 = local_1ba0._8_8_;
    uStack_ff0 = 0;
    uStack_fe8 = 0;
    local_1020 = local_15a0._0_8_;
    uStack_1018 = local_15a0._8_8_;
    uStack_1010 = auStack_1590._0_8_;
    uStack_1008 = auStack_1590._8_8_;
    auVar48._16_8_ = auStack_1590._0_8_;
    auVar48._0_16_ = local_15a0;
    auVar48._24_8_ = auStack_1590._8_8_;
    auVar7 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar40,auVar48);
    local_1328 = local_1b80;
    local_1330 = &local_1920;
    local_f80 = CONCAT44(fStack_1a9c,local_1aa0);
    uStack_f78 = CONCAT44(fStack_1a94,fStack_1a98);
    uStack_f70 = CONCAT44(fStack_1a8c,fStack_1a90);
    uStack_f68 = CONCAT44(uStack_13a8._4_4_,fStack_1a88);
    auVar41._4_4_ = fStack_1a9c;
    auVar41._0_4_ = local_1aa0;
    auVar41._8_4_ = fStack_1a98;
    auVar41._12_4_ = fStack_1a94;
    auVar41._16_4_ = fStack_1a90;
    auVar41._20_4_ = fStack_1a8c;
    auVar41._24_4_ = fStack_1a88;
    auVar41._28_4_ = uStack_13a8._4_4_;
    local_1b80._0_8_ = auVar7._0_8_;
    local_fa0 = local_1b80._0_8_;
    local_1b80._8_8_ = auVar7._8_8_;
    uStack_f98 = local_1b80._8_8_;
    uStack_f90 = 0;
    uStack_f88 = 0;
    local_fc0 = local_1620._0_8_;
    uStack_fb8 = local_1620._8_8_;
    uStack_fb0 = auStack_1610._0_8_;
    uStack_fa8 = auStack_1610._8_8_;
    auVar50._16_8_ = auStack_1610._0_8_;
    auVar50._0_16_ = local_1620;
    auVar50._24_8_ = auStack_1610._8_8_;
    auVar8 = vfmadd213ps_fma(ZEXT1632(auVar7),auVar41,auVar50);
    local_1340 = local_1b60;
    local_1348 = &local_18e0;
    local_f20 = CONCAT44(fStack_1a9c,local_1aa0);
    uStack_f18 = CONCAT44(fStack_1a94,fStack_1a98);
    uStack_f10 = CONCAT44(fStack_1a8c,fStack_1a90);
    uStack_f08 = CONCAT44(uStack_13a8._4_4_,fStack_1a88);
    auVar42._4_4_ = fStack_1a9c;
    auVar42._0_4_ = local_1aa0;
    auVar42._8_4_ = fStack_1a98;
    auVar42._12_4_ = fStack_1a94;
    auVar42._16_4_ = fStack_1a90;
    auVar42._20_4_ = fStack_1a8c;
    auVar42._24_4_ = fStack_1a88;
    auVar42._28_4_ = uStack_13a8._4_4_;
    local_1b60._0_8_ = auVar8._0_8_;
    local_f40 = local_1b60._0_8_;
    local_1b60._8_8_ = auVar8._8_8_;
    uStack_f38 = local_1b60._8_8_;
    uStack_f30 = 0;
    uStack_f28 = 0;
    local_f60 = local_16a0._0_8_;
    uStack_f58 = local_16a0._8_8_;
    uStack_f50 = auStack_1690._0_8_;
    uStack_f48 = auStack_1690._8_8_;
    auVar52._16_8_ = auStack_1690._0_8_;
    auVar52._0_16_ = local_16a0;
    auVar52._24_8_ = auStack_1690._8_8_;
    auVar9 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar42,auVar52);
    local_1350 = &local_1a80;
    local_1358 = local_1ae0;
    local_1360 = local_1b40;
    local_ec0 = CONCAT44(fStack_1a7c,local_1a80);
    uStack_eb8 = CONCAT44(fStack_1a74,fStack_1a78);
    uStack_eb0 = CONCAT44(fStack_1a6c,fStack_1a70);
    uStack_ea8 = CONCAT44(uStack_13a8._4_4_,fStack_1a68);
    auVar43._4_4_ = fStack_1a7c;
    auVar43._0_4_ = local_1a80;
    auVar43._8_4_ = fStack_1a78;
    auVar43._12_4_ = fStack_1a74;
    auVar43._16_4_ = fStack_1a70;
    auVar43._20_4_ = fStack_1a6c;
    auVar43._24_4_ = fStack_1a68;
    auVar43._28_4_ = uStack_13a8._4_4_;
    local_1ae0._0_8_ = auVar5._0_8_;
    local_ee0 = local_1ae0._0_8_;
    local_1ae0._8_8_ = auVar5._8_8_;
    uStack_ed8 = local_1ae0._8_8_;
    uStack_ed0 = 0;
    uStack_ec8 = 0;
    local_1b40._0_8_ = auVar9._0_8_;
    local_f00 = local_1b40._0_8_;
    local_1b40._8_8_ = auVar9._8_8_;
    uStack_ef8 = local_1b40._8_8_;
    uStack_ef0 = 0;
    uStack_ee8 = 0;
    auVar10 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar43,ZEXT1632(auVar9));
    local_1ac0._0_8_ = auVar10._0_8_;
    local_1ac0._8_8_ = auVar10._8_8_;
    uStack_1430 = 0;
    uStack_1428 = 0;
    local_1460 = local_1a60._0_8_;
    uStack_1458 = local_1a60._8_8_;
    uStack_1450 = local_1a60._16_8_;
    uStack_1448 = local_1a60._24_8_;
    local_1440._0_4_ = auVar10._0_4_;
    local_1440._4_4_ = auVar10._4_4_;
    uStack_1438._0_4_ = auVar10._8_4_;
    uStack_1438._4_4_ = auVar10._12_4_;
    fStack_17e4 = uStack_13a8._4_4_;
    local_1800 = (float)local_1440 * (float)local_13c0;
    fStack_17fc = local_1440._4_4_ * local_13c0._4_4_;
    fStack_17f8 = (float)uStack_1438 * (float)uStack_13b8;
    fStack_17f4 = uStack_1438._4_4_ * uStack_13b8._4_4_;
    fStack_17f0 = (float)uStack_13b0 * 0.0;
    fStack_17ec = uStack_13b0._4_4_ * 0.0;
    fStack_17e8 = (float)uStack_13a8 * 0.0;
    local_1280 = local_1a40._0_8_;
    uStack_1278 = local_1a40._8_8_;
    uStack_1270 = local_1a40._16_8_;
    uStack_1268 = local_1a40._24_8_;
    local_12a0 = local_16e0._0_8_;
    uStack_1298 = local_16e0._8_8_;
    uStack_1290 = auStack_16d0._0_8_;
    uStack_1288 = auStack_16d0._8_8_;
    auVar22._16_8_ = auStack_16d0._0_8_;
    auVar22._0_16_ = local_16e0;
    auVar22._24_8_ = auStack_16d0._8_8_;
    _local_1820 = vandps_avx(local_1a40,auVar22);
    local_e80 = local_1800 + (float)local_1820._0_4_;
    fStack_e7c = fStack_17fc + (float)local_1820._4_4_;
    fStack_e78 = fStack_17f8 + fStack_1818;
    fStack_e74 = fStack_17f4 + fStack_1814;
    fStack_e70 = fStack_17f0 + fStack_1810;
    fStack_e6c = fStack_17ec + fStack_180c;
    fStack_e68 = fStack_17e8 + fStack_1808;
    fStack_e64 = uStack_13a8._4_4_ + fStack_1804;
    local_ea0 = local_1a00._0_8_;
    uStack_e98 = local_1a00._8_8_;
    uStack_e90 = local_1a00._16_8_;
    uStack_e88 = local_1a00._24_8_;
    auVar25._4_4_ = fStack_e7c;
    auVar25._0_4_ = local_e80;
    auVar25._8_4_ = fStack_e78;
    auVar25._12_4_ = fStack_e74;
    auVar25._16_4_ = fStack_e70;
    auVar25._20_4_ = fStack_e6c;
    auVar25._24_4_ = fStack_e68;
    auVar25._28_4_ = fStack_e64;
    _local_20a0 = vorps_avx(auVar25,local_1a00);
    local_20c0._0_4_ = local_2240._0_4_;
    local_20c0._4_4_ = local_2240._4_4_;
    uStack_20b8._0_4_ = local_2240._8_4_;
    uStack_20b8._4_4_ = local_2240._12_4_;
    uStack_20b0._0_4_ = local_2240._16_4_;
    uStack_20b0._4_4_ = local_2240._20_4_;
    uStack_20a8._0_4_ = local_2240._24_4_;
    uStack_20a8._4_4_ = local_2240._28_4_;
    local_2260 = (float)local_20a0._0_4_ + (float)local_20c0;
    fStack_225c = (float)local_20a0._4_4_ + local_20c0._4_4_;
    fStack_2258 = fStack_2098 + (float)uStack_20b8;
    fStack_2254 = fStack_2094 + uStack_20b8._4_4_;
    fStack_2250 = fStack_2090 + (float)uStack_20b0;
    fStack_224c = fStack_208c + uStack_20b0._4_4_;
    fStack_2248 = fStack_2088 + (float)uStack_20a8;
    fStack_2244 = fStack_2084 + uStack_20a8._4_4_;
    local_1c00 = local_2200._0_8_;
    uStack_1bf8 = local_2200._8_8_;
    uStack_1bf0 = local_2200._16_8_;
    uStack_1be8 = local_2200._24_8_;
    local_1c20 = local_1fe0._0_8_;
    uStack_1c18 = local_1fe0._8_8_;
    uStack_1c10 = auStack_1fd0._0_8_;
    uStack_1c08 = auStack_1fd0._8_8_;
    auVar19._16_8_ = auStack_1fd0._0_8_;
    auVar19._0_16_ = local_1fe0;
    auVar19._24_8_ = auStack_1fd0._8_8_;
    auVar3 = vorps_avx(local_2200,auVar19);
    auVar12._16_8_ = auStack_2050._0_8_;
    auVar12._0_16_ = local_2060;
    auVar12._24_8_ = auStack_2050._8_8_;
    local_2280 = vcmpps_avx(auVar3,auVar12,1);
    local_1e80 = local_21c0._0_8_;
    uStack_1e78 = local_21c0._8_8_;
    uStack_1e70 = local_21c0._16_8_;
    uStack_1e68 = local_21c0._24_8_;
    local_1c40 = local_2220._0_8_;
    uStack_1c38 = local_2220._8_8_;
    uStack_1c30 = local_2220._16_8_;
    uStack_1c28 = local_2220._24_8_;
    local_1c60 = local_1fa0._0_8_;
    uStack_1c58 = local_1fa0._8_8_;
    uStack_1c50 = auStack_1f90._0_8_;
    uStack_1c48 = auStack_1f90._8_8_;
    auVar18._16_8_ = auStack_1f90._0_8_;
    auVar18._0_16_ = local_1fa0;
    auVar18._24_8_ = auStack_1f90._8_8_;
    local_1ea0 = vorps_avx(local_2220,auVar18);
    local_1cc0 = vandps_avx(local_21c0,local_1ea0);
    local_cc0 = local_21c0._0_8_;
    uStack_cb8 = local_21c0._8_8_;
    uStack_cb0 = local_21c0._16_8_;
    uStack_ca8 = local_21c0._24_8_;
    local_1ec0 = local_2280._0_8_;
    uStack_1eb8 = local_2280._8_8_;
    uStack_1eb0 = local_2280._16_8_;
    uStack_1ea8 = local_2280._24_8_;
    local_1ee0 = local_1fe0._0_8_;
    uStack_1ed8 = local_1fe0._8_8_;
    uStack_1ed0 = auStack_1fd0._0_8_;
    uStack_1ec8 = auStack_1fd0._8_8_;
    auVar14._16_8_ = auStack_1fd0._0_8_;
    auVar14._0_16_ = local_1fe0;
    auVar14._24_8_ = auStack_1fd0._8_8_;
    local_1c80 = vandps_avx(local_2280,auVar14);
    local_c80 = local_2280._0_8_;
    uStack_c78 = local_2280._8_8_;
    uStack_c70 = local_2280._16_8_;
    uStack_c68 = local_2280._24_8_;
    local_ca0 = local_2060._0_8_;
    uStack_c98 = local_2060._8_8_;
    uStack_c90 = auStack_2050._0_8_;
    uStack_c88 = auStack_2050._8_8_;
    auVar28._16_8_ = auStack_2050._0_8_;
    auVar28._0_16_ = local_2060;
    auVar28._24_8_ = auStack_2050._8_8_;
    local_1ca0 = vandnps_avx(local_2280,auVar28);
    local_ce0 = vorps_avx(local_1c80,local_1ca0);
    local_1ce0 = vandnps_avx(local_21c0,local_ce0);
    local_22a0 = vorps_avx(local_1cc0,local_1ce0);
    local_1f00 = local_21e0._0_8_;
    uStack_1ef8 = local_21e0._8_8_;
    uStack_1ef0 = local_21e0._16_8_;
    uStack_1ee8 = local_21e0._24_8_;
    local_1f20 = CONCAT44(fStack_225c,local_2260);
    uStack_1f18 = CONCAT44(fStack_2254,fStack_2258);
    uStack_1f10 = CONCAT44(fStack_224c,fStack_2250);
    uStack_1f08 = CONCAT44(fStack_2244,fStack_2248);
    auVar13._8_8_ = uStack_1f18;
    auVar13._0_8_ = local_1f20;
    auVar13._16_8_ = uStack_1f10;
    auVar13._24_8_ = uStack_1f08;
    local_1d00 = vandps_avx(local_21e0,auVar13);
    local_d20 = local_22a0._0_8_;
    uStack_d18 = local_22a0._8_8_;
    uStack_d10 = local_22a0._16_8_;
    uStack_d08 = local_22a0._24_8_;
    local_d00._0_4_ = local_21e0._0_4_;
    local_d00._4_4_ = local_21e0._4_4_;
    uStack_cf8._0_4_ = local_21e0._8_4_;
    uStack_cf8._4_4_ = local_21e0._12_4_;
    uStack_cf0._0_4_ = local_21e0._16_4_;
    uStack_cf0._4_4_ = local_21e0._20_4_;
    uStack_ce8._0_4_ = local_21e0._24_4_;
    uStack_ce8._4_4_ = local_21e0._28_4_;
    auVar71._0_4_ = (uint)local_d00 ^ auVar1._0_4_;
    auVar71._4_4_ = local_d00._4_4_ ^ auVar1._4_4_;
    auVar71._8_4_ = (uint)uStack_cf8 ^ auVar1._8_4_;
    auVar71._12_4_ = uStack_cf8._4_4_ ^ auVar1._12_4_;
    auVar71._16_4_ = (uint)uStack_cf0 ^ auVar1._16_4_;
    auVar71._20_4_ = uStack_cf0._4_4_ ^ auVar1._20_4_;
    auVar71._24_4_ = (uint)uStack_ce8 ^ auVar1._24_4_;
    auVar71._28_4_ = uStack_ce8._4_4_ ^ auVar1._28_4_;
    local_1d20 = vandps_avx(auVar71,local_22a0);
    local_23e0 = vorps_avx(local_1d00,local_1d20);
    local_2318 = local_2368;
    local_2340 = local_23e0._0_8_;
    uStack_2338 = local_23e0._8_8_;
    uStack_2330 = local_23e0._16_8_;
    uStack_2328 = local_23e0._24_8_;
    *(undefined8 *)local_2368 = local_23e0._0_8_;
    *(undefined8 *)(local_2368 + 2) = local_23e0._8_8_;
    *(undefined8 *)(local_2368 + 4) = local_23e0._16_8_;
    *(undefined8 *)(local_2368 + 6) = local_23e0._24_8_;
    local_2358 = local_2358 + 1;
    local_2360 = local_2360 + 1;
    local_2368 = local_2368 + 8;
    local_2100 = local_23c0;
    uStack_20f8 = uStack_23b8;
    uStack_20f0 = uStack_23b0;
    uStack_20e8 = uStack_23a8;
    local_20e0 = local_23a0;
    uStack_20d8 = uStack_2398;
    uStack_20d0 = uStack_2390;
    uStack_20c8 = uStack_2388;
    local_20c0 = local_2240._0_8_;
    uStack_20b8 = local_2240._8_8_;
    uStack_20b0 = local_2240._16_8_;
    uStack_20a8 = local_2240._24_8_;
    local_203c = local_2040;
    local_2038 = local_2040;
    local_2034 = local_2040;
    local_2030 = local_2040;
    local_202c = local_2040;
    local_2028 = local_2040;
    local_2024 = local_2040;
    local_1ffc = local_2000;
    local_1ff8 = local_2000;
    local_1ff4 = local_2000;
    local_1ff0 = local_2000;
    local_1fec = local_2000;
    local_1fe8 = local_2000;
    local_1fe4 = local_2000;
    local_1fbc = local_1fc0;
    local_1fb8 = local_1fc0;
    local_1fb4 = local_1fc0;
    local_1fb0 = local_1fc0;
    local_1fac = local_1fc0;
    local_1fa8 = local_1fc0;
    local_1fa4 = local_1fc0;
    local_1f7c = local_1f80;
    local_1f78 = local_1f80;
    local_1f74 = local_1f80;
    local_1f70 = local_1f80;
    local_1f6c = local_1f80;
    local_1f68 = local_1f80;
    local_1f64 = local_1f80;
    local_1f60 = local_23c0;
    uStack_1f58 = uStack_23b8;
    uStack_1f50 = uStack_23b0;
    uStack_1f48 = uStack_23a8;
    local_1f40 = local_23a0;
    uStack_1f38 = uStack_2398;
    uStack_1f30 = uStack_2390;
    uStack_1f28 = uStack_2388;
    local_1de0 = local_23a0;
    uStack_1dd8 = uStack_2398;
    uStack_1dd0 = uStack_2390;
    uStack_1dc8 = uStack_2388;
    local_1da0 = local_23c0;
    uStack_1d98 = uStack_23b8;
    uStack_1d90 = uStack_23b0;
    uStack_1d88 = uStack_23a8;
    local_1ba0 = ZEXT1632(auVar6);
    local_1b80 = ZEXT1632(auVar7);
    local_1b60 = ZEXT1632(auVar8);
    local_1b40 = ZEXT1632(auVar9);
    local_1b20 = ZEXT1632(auVar2);
    local_1b00 = ZEXT1632(auVar4);
    local_1ae0 = ZEXT1632(auVar5);
    local_1ac0 = ZEXT1632(auVar10);
    local_177c = local_1780;
    local_1778 = local_1780;
    local_1774 = local_1780;
    local_1770 = local_1780;
    local_176c = local_1780;
    local_1768 = local_1780;
    local_1764 = local_1780;
    local_173c = local_1740;
    local_1738 = local_1740;
    local_1734 = local_1740;
    local_1730 = local_1740;
    local_172c = local_1740;
    local_1728 = local_1740;
    local_1724 = local_1740;
    local_16fc = local_1700;
    local_16f8 = local_1700;
    local_16f4 = local_1700;
    local_16f0 = local_1700;
    local_16ec = local_1700;
    local_16e8 = local_1700;
    local_16e4 = local_1700;
    local_16bc = local_16c0;
    local_16b8 = local_16c0;
    local_16b4 = local_16c0;
    local_16b0 = local_16c0;
    local_16ac = local_16c0;
    local_16a8 = local_16c0;
    local_16a4 = local_16c0;
    local_167c = local_1680;
    local_1678 = local_1680;
    local_1674 = local_1680;
    local_1670 = local_1680;
    local_166c = local_1680;
    local_1668 = local_1680;
    local_1664 = local_1680;
    local_163c = local_1640;
    local_1638 = local_1640;
    local_1634 = local_1640;
    local_1630 = local_1640;
    local_162c = local_1640;
    local_1628 = local_1640;
    local_1624 = local_1640;
    local_15fc = local_1600;
    local_15f8 = local_1600;
    local_15f4 = local_1600;
    local_15f0 = local_1600;
    local_15ec = local_1600;
    local_15e8 = local_1600;
    local_15e4 = local_1600;
    local_15bc = local_15c0;
    local_15b8 = local_15c0;
    local_15b4 = local_15c0;
    local_15b0 = local_15c0;
    local_15ac = local_15c0;
    local_15a8 = local_15c0;
    local_15a4 = local_15c0;
    local_157c = local_1580;
    local_1578 = local_1580;
    local_1574 = local_1580;
    local_1570 = local_1580;
    local_156c = local_1580;
    local_1568 = local_1580;
    local_1564 = local_1580;
    local_153c = local_1540;
    local_1538 = local_1540;
    local_1534 = local_1540;
    local_1530 = local_1540;
    local_152c = local_1540;
    local_1528 = local_1540;
    local_1524 = local_1540;
    local_14fc = local_1500;
    local_14f8 = local_1500;
    local_14f4 = local_1500;
    local_14f0 = local_1500;
    local_14ec = local_1500;
    local_14e8 = local_1500;
    local_14e4 = local_1500;
    local_14bc = local_14c0;
    local_14b8 = local_14c0;
    local_14b4 = local_14c0;
    local_14b0 = local_14c0;
    local_14ac = local_14c0;
    local_14a8 = local_14c0;
    local_14a4 = local_14c0;
    local_147c = local_1480;
    local_1478 = local_1480;
    local_1474 = local_1480;
    local_1470 = local_1480;
    local_146c = local_1480;
    local_1468 = local_1480;
    local_1464 = local_1480;
    local_1440 = local_1ac0._0_8_;
    uStack_1438 = local_1ac0._8_8_;
    local_1400 = local_1420;
    uStack_13f8 = uStack_1418;
    uStack_13f0 = uStack_1410;
    uStack_13e8 = uStack_1408;
    local_13c0 = local_13e0;
    uStack_13b8 = uStack_13d8;
    uStack_13b0 = uStack_13d0;
    uStack_13a8 = uStack_13c8;
    local_1320 = local_1338;
    local_1308 = local_1338;
    local_12f0 = local_1338;
    local_12d8 = local_1338;
    local_12c0 = local_1338;
    local_12a8 = local_1338;
    local_d00 = local_21e0._0_8_;
    uStack_cf8 = local_21e0._8_8_;
    uStack_cf0 = local_21e0._16_8_;
    uStack_ce8 = local_21e0._24_8_;
  }
  for (; local_236c = in_ECX, local_2374 + 3 < in_ECX; local_2374 = local_2374 + 4) {
    local_2308 = local_2358;
    local_23f0 = *(undefined8 *)*local_2358;
    uStack_23e8 = *(undefined8 *)(*local_2358 + 8);
    local_2310 = local_2360;
    local_2400 = *(undefined8 *)*local_2360;
    uStack_23f8 = *(undefined8 *)(*local_2360 + 8);
    local_22c0 = &local_236d;
    local_22c8 = &local_23f0;
    local_22d0 = &local_2400;
    local_8a4 = 0;
    local_884 = 0;
    local_8a0 = 0;
    local_ba0 = 0;
    uStack_b98 = 0;
    local_8c4 = 0x80000000;
    local_8a8 = 0x80000000;
    local_8c0 = 0x80000000;
    local_bb0 = 0x8000000080000000;
    uStack_ba8 = 0x8000000080000000;
    local_8e4 = 0x40490fdb;
    local_8c8 = 0x40490fdb;
    local_8e0 = 0x40490fdb;
    local_bc0 = 0x40490fdb40490fdb;
    uStack_bb8 = 0x40490fdb40490fdb;
    local_904 = 0x3fc90fdb;
    local_8e8 = 0x3fc90fdb;
    local_900 = 0x3fc90fdb;
    local_bd0 = 0x3fc90fdb3fc90fdb;
    uStack_bc8 = 0x3fc90fdb3fc90fdb;
    local_be0 = vcmpps_avx(*(undefined1 (*) [16])*local_2360,ZEXT816(0),4);
    local_bf0 = vcmpps_avx(*(undefined1 (*) [16])*local_2358,ZEXT816(0),4);
    local_a40 = local_be0._0_8_;
    uStack_a38 = local_be0._8_8_;
    local_a50 = local_bf0._0_8_;
    uStack_a48 = local_bf0._8_8_;
    local_c00 = vpand_avx(local_be0,local_bf0);
    auVar7._8_8_ = 0x8000000080000000;
    auVar7._0_8_ = 0x8000000080000000;
    local_c10 = vpand_avx(auVar7,*(undefined1 (*) [16])*local_2360);
    auVar6._8_8_ = 0x8000000080000000;
    auVar6._0_8_ = 0x8000000080000000;
    local_c20 = vpand_avx(auVar6,*(undefined1 (*) [16])*local_2358);
    local_ac0 = vcmpps_avx(*(undefined1 (*) [16])*local_2360,ZEXT816(0),1);
    local_aa0 = vcmpps_avx(*(undefined1 (*) [16])*local_2358,ZEXT816(0),1);
    auVar2._8_8_ = 0x8000000080000000;
    auVar2._0_8_ = 0x8000000080000000;
    local_980 = vpand_avx(local_aa0,auVar2);
    auVar10._8_8_ = 0x40490fdb40490fdb;
    auVar10._0_8_ = 0x40490fdb40490fdb;
    local_ad0 = vpor_avx(local_980,auVar10);
    local_c30 = vpand_avx(local_ac0,local_ad0);
    local_690 = vdivps_avx(*(undefined1 (*) [16])*local_2358,*(undefined1 (*) [16])*local_2360);
    local_114 = 0x80000000;
    local_f4 = 0x80000000;
    local_110 = 0x80000000;
    local_6a0 = 0x8000000080000000;
    uStack_698 = 0x8000000080000000;
    local_134 = 0x3f800000;
    local_118 = 0x3f800000;
    local_130 = 0x3f800000;
    local_6b0 = 0x3f8000003f800000;
    uStack_6a8 = 0x3f8000003f800000;
    local_154 = 0xbf800000;
    local_138 = 0xbf800000;
    local_150 = 0xbf800000;
    local_6c0 = 0xbf800000bf800000;
    uStack_6b8 = 0xbf800000bf800000;
    local_174 = 0x3fc90fdb;
    local_158 = 0x3fc90fdb;
    local_170 = 0x3fc90fdb;
    local_6d0 = 0x3fc90fdb3fc90fdb;
    uStack_6c8 = 0x3fc90fdb3fc90fdb;
    local_194 = 0x3f800000;
    local_178 = 0x3f800000;
    local_190 = 0x3f800000;
    local_6e0 = 0x3f8000003f800000;
    uStack_6d8 = 0x3f8000003f800000;
    local_1b4 = 0xbeaaaa53;
    local_198 = 0xbeaaaa53;
    local_1b0 = 0xbeaaaa53;
    local_6f0 = 0xbeaaaa53beaaaa53;
    uStack_6e8 = 0xbeaaaa53beaaaa53;
    local_1d4 = 0x3e4cb974;
    local_1b8 = 0x3e4cb974;
    local_1d0 = 0x3e4cb974;
    local_700 = 0x3e4cb9743e4cb974;
    uStack_6f8 = 0x3e4cb9743e4cb974;
    local_1f4 = 0xbe117200;
    local_1d8 = 0xbe117200;
    local_1f0 = 0xbe117200;
    local_710 = 0xbe117200be117200;
    uStack_708 = 0xbe117200be117200;
    local_214 = 0x3dd9ed24;
    local_1f8 = 0x3dd9ed24;
    local_210 = 0x3dd9ed24;
    local_720 = 0x3dd9ed243dd9ed24;
    uStack_718 = 0x3dd9ed243dd9ed24;
    local_234 = 0xbd99b01e;
    local_218 = 0xbd99b01e;
    local_230 = 0xbd99b01e;
    local_730 = 0xbd99b01ebd99b01e;
    uStack_728 = 0xbd99b01ebd99b01e;
    local_254 = 0x3d2edd4e;
    local_238 = 0x3d2edd4e;
    local_250 = 0x3d2edd4e;
    local_740 = 0x3d2edd4e3d2edd4e;
    uStack_738 = 0x3d2edd4e3d2edd4e;
    local_274 = 0xbc83a25c;
    local_258 = 0xbc83a25c;
    local_270 = 0xbc83a25c;
    local_750 = 0xbc83a25cbc83a25c;
    uStack_748 = 0xbc83a25cbc83a25c;
    local_294 = 0x3b3ac537;
    local_278 = 0x3b3ac537;
    local_290 = 0x3b3ac537;
    local_760 = 0x3b3ac5373b3ac537;
    uStack_758 = 0x3b3ac5373b3ac537;
    local_580 = local_690._0_8_;
    uStack_578 = local_690._8_8_;
    auVar31._8_8_ = 0x8000000080000000;
    auVar31._0_8_ = 0x8000000080000000;
    local_770 = vpand_avx(auVar31,local_690);
    local_b0 = local_690._0_8_;
    uStack_a8 = local_690._8_8_;
    auVar35._8_8_ = 0x8000000080000000;
    auVar35._0_8_ = 0x8000000080000000;
    auVar2 = vpcmpeqd_avx(auVar10,auVar10);
    local_780 = vpandn_avx(auVar35,local_690);
    local_2c0 = local_780._0_8_;
    uStack_2b8 = local_780._8_8_;
    auVar33._8_8_ = 0x3f8000003f800000;
    auVar33._0_8_ = 0x3f8000003f800000;
    local_790 = vcmpps_avx(auVar33,local_780,1);
    local_590 = local_790._0_8_;
    uStack_588 = local_790._8_8_;
    auVar30._8_8_ = 0xbf800000bf800000;
    auVar30._0_8_ = 0xbf800000bf800000;
    local_2d0 = vpand_avx(local_790,auVar30);
    local_c0 = local_790._0_8_;
    uStack_b8 = local_790._8_8_;
    local_d0 = local_780._0_8_;
    uStack_c8 = local_780._8_8_;
    local_2e0 = vpandn_avx(local_790,local_780);
    local_5f0 = vpor_avx(local_2d0,local_2e0);
    local_5b0 = local_790._0_8_;
    uStack_5a8 = local_790._8_8_;
    local_5c0 = local_780._0_8_;
    uStack_5b8 = local_780._8_8_;
    local_2f0 = vpand_avx(local_790,local_780);
    local_e0 = local_790._0_8_;
    uStack_d8 = local_790._8_8_;
    auVar34._8_8_ = 0x3f8000003f800000;
    auVar34._0_8_ = 0x3f8000003f800000;
    local_300 = vpandn_avx(local_790,auVar34);
    local_600 = vpor_avx(local_2f0,local_300);
    local_7a0 = vdivps_avx(local_5f0,local_600);
    local_620 = local_7a0._0_8_;
    uStack_618 = local_7a0._8_8_;
    local_610._0_4_ = local_7a0._0_4_;
    local_610._4_4_ = local_7a0._4_4_;
    uStack_608._0_4_ = local_7a0._8_4_;
    uStack_608._4_4_ = local_7a0._12_4_;
    local_7b0 = (float)local_610 * (float)local_610;
    fStack_7ac = local_610._4_4_ * local_610._4_4_;
    fStack_7a8 = (float)uStack_608 * (float)uStack_608;
    fStack_7a4 = uStack_608._4_4_ * uStack_608._4_4_;
    local_640 = CONCAT44(fStack_7ac,local_7b0);
    uStack_638 = CONCAT44(fStack_7a4,fStack_7a8);
    local_7c0 = local_7b0 * local_7b0;
    fStack_7bc = fStack_7ac * fStack_7ac;
    fStack_7b8 = fStack_7a8 * fStack_7a8;
    fStack_7b4 = fStack_7a4 * fStack_7a4;
    local_538 = &local_7c0;
    local_4b0 = &local_750;
    local_4b8 = &local_730;
    local_480 = CONCAT44(fStack_7bc,local_7c0);
    uStack_478 = CONCAT44(fStack_7b4,fStack_7b8);
    auVar53._4_4_ = fStack_7bc;
    auVar53._0_4_ = local_7c0;
    auVar53._8_4_ = fStack_7b8;
    auVar53._12_4_ = fStack_7b4;
    local_490 = 0xbc83a25cbc83a25c;
    uStack_488 = 0xbc83a25cbc83a25c;
    auVar62._8_8_ = 0xbc83a25cbc83a25c;
    auVar62._0_8_ = 0xbc83a25cbc83a25c;
    local_4a0 = 0xbd99b01ebd99b01e;
    uStack_498 = 0xbd99b01ebd99b01e;
    auVar64._8_8_ = 0xbd99b01ebd99b01e;
    auVar64._0_8_ = 0xbd99b01ebd99b01e;
    local_800 = vfmadd213ps_fma(auVar62,auVar53,auVar64);
    local_4c8 = local_800;
    local_4d0 = &local_710;
    local_450 = CONCAT44(fStack_7bc,local_7c0);
    uStack_448 = CONCAT44(fStack_7b4,fStack_7b8);
    auVar54._4_4_ = fStack_7bc;
    auVar54._0_4_ = local_7c0;
    auVar54._8_4_ = fStack_7b8;
    auVar54._12_4_ = fStack_7b4;
    local_460 = local_800._0_8_;
    uStack_458 = local_800._8_8_;
    local_470 = 0xbe117200be117200;
    uStack_468 = 0xbe117200be117200;
    auVar66._8_8_ = 0xbe117200be117200;
    auVar66._0_8_ = 0xbe117200be117200;
    local_7f0 = vfmadd213ps_fma(local_800,auVar54,auVar66);
    local_4e0 = local_7f0;
    local_4e8 = &local_6f0;
    local_420 = CONCAT44(fStack_7bc,local_7c0);
    uStack_418 = CONCAT44(fStack_7b4,fStack_7b8);
    auVar55._4_4_ = fStack_7bc;
    auVar55._0_4_ = local_7c0;
    auVar55._8_4_ = fStack_7b8;
    auVar55._12_4_ = fStack_7b4;
    local_430 = local_7f0._0_8_;
    uStack_428 = local_7f0._8_8_;
    local_440 = 0xbeaaaa53beaaaa53;
    uStack_438 = 0xbeaaaa53beaaaa53;
    auVar68._8_8_ = 0xbeaaaa53beaaaa53;
    auVar68._0_8_ = 0xbeaaaa53beaaaa53;
    local_7e0 = vfmadd213ps_fma(local_7f0,auVar55,auVar68);
    local_4f8 = &local_760;
    local_500 = &local_740;
    local_3f0 = CONCAT44(fStack_7bc,local_7c0);
    uStack_3e8 = CONCAT44(fStack_7b4,fStack_7b8);
    auVar56._4_4_ = fStack_7bc;
    auVar56._0_4_ = local_7c0;
    auVar56._8_4_ = fStack_7b8;
    auVar56._12_4_ = fStack_7b4;
    local_400 = 0x3b3ac5373b3ac537;
    uStack_3f8 = 0x3b3ac5373b3ac537;
    auVar61._8_8_ = 0x3b3ac5373b3ac537;
    auVar61._0_8_ = 0x3b3ac5373b3ac537;
    local_410 = 0x3d2edd4e3d2edd4e;
    uStack_408 = 0x3d2edd4e3d2edd4e;
    auVar63._8_8_ = 0x3d2edd4e3d2edd4e;
    auVar63._0_8_ = 0x3d2edd4e3d2edd4e;
    local_840 = vfmadd213ps_fma(auVar61,auVar56,auVar63);
    local_510 = local_840;
    local_518 = &local_720;
    local_3c0 = CONCAT44(fStack_7bc,local_7c0);
    uStack_3b8 = CONCAT44(fStack_7b4,fStack_7b8);
    auVar57._4_4_ = fStack_7bc;
    auVar57._0_4_ = local_7c0;
    auVar57._8_4_ = fStack_7b8;
    auVar57._12_4_ = fStack_7b4;
    local_3d0 = local_840._0_8_;
    uStack_3c8 = local_840._8_8_;
    local_3e0 = 0x3dd9ed243dd9ed24;
    uStack_3d8 = 0x3dd9ed243dd9ed24;
    auVar65._8_8_ = 0x3dd9ed243dd9ed24;
    auVar65._0_8_ = 0x3dd9ed243dd9ed24;
    local_830 = vfmadd213ps_fma(local_840,auVar57,auVar65);
    local_528 = local_830;
    local_530 = &local_700;
    local_390 = CONCAT44(fStack_7bc,local_7c0);
    uStack_388 = CONCAT44(fStack_7b4,fStack_7b8);
    auVar58._4_4_ = fStack_7bc;
    auVar58._0_4_ = local_7c0;
    auVar58._8_4_ = fStack_7b8;
    auVar58._12_4_ = fStack_7b4;
    local_3a0 = local_830._0_8_;
    uStack_398 = local_830._8_8_;
    local_3b0 = 0x3e4cb9743e4cb974;
    uStack_3a8 = 0x3e4cb9743e4cb974;
    auVar67._8_8_ = 0x3e4cb9743e4cb974;
    auVar67._0_8_ = 0x3e4cb9743e4cb974;
    local_820 = vfmadd213ps_fma(local_830,auVar58,auVar67);
    local_540 = local_820;
    local_548 = &local_6e0;
    local_360 = CONCAT44(fStack_7bc,local_7c0);
    uStack_358 = CONCAT44(fStack_7b4,fStack_7b8);
    auVar59._4_4_ = fStack_7bc;
    auVar59._0_4_ = local_7c0;
    auVar59._8_4_ = fStack_7b8;
    auVar59._12_4_ = fStack_7b4;
    local_370 = local_820._0_8_;
    uStack_368 = local_820._8_8_;
    local_380 = 0x3f8000003f800000;
    uStack_378 = 0x3f8000003f800000;
    auVar69._8_8_ = 0x3f8000003f800000;
    auVar69._0_8_ = 0x3f8000003f800000;
    local_810 = vfmadd213ps_fma(local_820,auVar59,auVar69);
    local_550 = &local_7b0;
    local_558 = local_7e0;
    local_560 = local_810;
    local_330 = CONCAT44(fStack_7ac,local_7b0);
    uStack_328 = CONCAT44(fStack_7a4,fStack_7a8);
    auVar60._4_4_ = fStack_7ac;
    auVar60._0_4_ = local_7b0;
    auVar60._8_4_ = fStack_7a8;
    auVar60._12_4_ = fStack_7a4;
    local_340 = local_7e0._0_8_;
    uStack_338 = local_7e0._8_8_;
    local_350 = local_810._0_8_;
    uStack_348 = local_810._8_8_;
    local_7d0 = vfmadd213ps_fma(local_7e0,auVar60,local_810);
    local_660 = local_7a0._0_8_;
    uStack_658 = local_7a0._8_8_;
    local_650._0_4_ = local_7d0._0_4_;
    local_650._4_4_ = local_7d0._4_4_;
    uStack_648._0_4_ = local_7d0._8_4_;
    uStack_648._4_4_ = local_7d0._12_4_;
    local_670 = (float)local_650 * (float)local_610;
    fStack_66c = local_650._4_4_ * local_610._4_4_;
    fStack_668 = (float)uStack_648 * (float)uStack_608;
    fStack_664 = uStack_648._4_4_ * uStack_608._4_4_;
    local_5d0 = local_790._0_8_;
    uStack_5c8 = local_790._8_8_;
    auVar29._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar29._0_8_ = 0x3fc90fdb3fc90fdb;
    _local_680 = vpand_avx(local_790,auVar29);
    local_310 = local_670 + (float)local_680._0_4_;
    fStack_30c = fStack_66c + (float)local_680._4_4_;
    fStack_308 = fStack_668 + fStack_678;
    fStack_304 = fStack_664 + fStack_674;
    local_320 = local_770._0_8_;
    uStack_318 = local_770._8_8_;
    auVar32._4_4_ = fStack_30c;
    auVar32._0_4_ = local_310;
    auVar32._8_4_ = fStack_308;
    auVar32._12_4_ = fStack_304;
    _local_b60 = vpor_avx(auVar32,local_770);
    local_b70._0_4_ = local_c30._0_4_;
    local_b70._4_4_ = local_c30._4_4_;
    uStack_b68._0_4_ = local_c30._8_4_;
    uStack_b68._4_4_ = local_c30._12_4_;
    local_c40 = (float)local_b60._0_4_ + (float)local_b70;
    fStack_c3c = (float)local_b60._4_4_ + local_b70._4_4_;
    fStack_c38 = fStack_b58 + (float)uStack_b68;
    fStack_c34 = fStack_b54 + uStack_b68._4_4_;
    local_9a0 = local_c10._0_8_;
    uStack_998 = local_c10._8_8_;
    auVar9._8_8_ = 0x40490fdb40490fdb;
    auVar9._0_8_ = 0x40490fdb40490fdb;
    local_960 = vpor_avx(local_c10,auVar9);
    local_c50 = vcmpps_avx(local_960,ZEXT816(0),1);
    local_ae0 = local_bf0._0_8_;
    uStack_ad8 = local_bf0._8_8_;
    local_9c0 = local_c20._0_8_;
    uStack_9b8 = local_c20._8_8_;
    auVar8._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar8._0_8_ = 0x3fc90fdb3fc90fdb;
    local_af0 = vpor_avx(local_c20,auVar8);
    local_a00 = vpand_avx(local_bf0,local_af0);
    local_60 = local_bf0._0_8_;
    uStack_58 = local_bf0._8_8_;
    local_b00 = local_c50._0_8_;
    uStack_af8 = local_c50._8_8_;
    auVar5._8_8_ = 0x40490fdb40490fdb;
    auVar5._0_8_ = 0x40490fdb40490fdb;
    local_9e0 = vpand_avx(local_c50,auVar5);
    local_40 = local_c50._0_8_;
    uStack_38 = local_c50._8_8_;
    local_9f0 = vpandn_avx(local_c50,ZEXT816(0));
    local_70 = vpor_avx(local_9e0,local_9f0);
    local_a10 = vpandn_avx(local_bf0,local_70);
    local_c60 = vpor_avx(local_a00,local_a10);
    local_b20 = local_c00._0_8_;
    uStack_b18 = local_c00._8_8_;
    local_b30 = CONCAT44(fStack_c3c,local_c40);
    uStack_b28 = CONCAT44(fStack_c34,fStack_c38);
    auVar4._8_8_ = uStack_b28;
    auVar4._0_8_ = local_b30;
    local_a20 = vpand_avx(local_c00,auVar4);
    local_80 = local_c00._0_8_;
    uStack_78 = local_c00._8_8_;
    local_90 = local_c60._0_8_;
    uStack_88 = local_c60._8_8_;
    local_a30 = vpand_avx(local_c00 ^ auVar2,local_c60);
    auVar2 = vpor_avx(local_a20,local_a30);
    local_22f0 = local_2368;
    local_2410 = auVar2._0_8_;
    local_2300 = local_2410;
    uStack_2408 = auVar2._8_8_;
    uStack_22f8 = uStack_2408;
    *(undefined8 *)local_2368 = local_2410;
    *(undefined8 *)(local_2368 + 2) = uStack_2408;
    local_2358 = (undefined1 (*) [32])(*local_2358 + 0x10);
    local_2360 = (undefined1 (*) [32])(*local_2360 + 0x10);
    local_2368 = local_2368 + 4;
    local_b90 = local_2400;
    uStack_b88 = uStack_23f8;
    local_b80 = local_23f0;
    uStack_b78 = uStack_23e8;
    local_b70 = local_c30._0_8_;
    uStack_b68 = local_c30._8_8_;
    local_b50 = local_2400;
    uStack_b48 = uStack_23f8;
    local_b40 = local_23f0;
    uStack_b38 = uStack_23e8;
    local_b10 = local_bc0;
    uStack_b08 = uStack_bb8;
    local_ab0 = local_bb0;
    uStack_aa8 = uStack_ba8;
    local_a90 = local_23f0;
    uStack_a88 = uStack_23e8;
    local_a80 = local_bb0;
    uStack_a78 = uStack_ba8;
    local_a70 = local_2400;
    uStack_a68 = uStack_23f8;
    local_a60 = local_bb0;
    uStack_a58 = uStack_ba8;
    local_9d0 = local_bd0;
    uStack_9c8 = uStack_bc8;
    local_9b0 = local_bc0;
    uStack_9a8 = uStack_bb8;
    local_990 = local_bc0;
    uStack_988 = uStack_bb8;
    local_970 = local_ba0;
    uStack_968 = uStack_b98;
    local_950 = local_ba0;
    uStack_948 = uStack_b98;
    local_940 = local_23f0;
    uStack_938 = uStack_23e8;
    local_930 = local_ba0;
    uStack_928 = uStack_b98;
    local_920 = local_2400;
    uStack_918 = uStack_23f8;
    uStack_8fc = local_900;
    uStack_8f8 = local_900;
    uStack_8f4 = local_900;
    uStack_8dc = local_8e0;
    uStack_8d8 = local_8e0;
    uStack_8d4 = local_8e0;
    uStack_8bc = local_8c0;
    uStack_8b8 = local_8c0;
    uStack_8b4 = local_8c0;
    uStack_89c = local_8a0;
    uStack_898 = local_8a0;
    uStack_894 = local_8a0;
    local_880 = local_ba0;
    uStack_878 = uStack_b98;
    local_870 = local_23f0;
    uStack_868 = uStack_23e8;
    local_860 = local_ba0;
    uStack_858 = uStack_b98;
    local_850 = local_2400;
    uStack_848 = uStack_23f8;
    local_650 = local_7d0._0_8_;
    uStack_648 = local_7d0._8_8_;
    local_630 = local_640;
    uStack_628 = uStack_638;
    local_610 = local_620;
    uStack_608 = uStack_618;
    local_5e0 = local_6d0;
    uStack_5d8 = uStack_6c8;
    local_5a0 = local_6c0;
    uStack_598 = uStack_6b8;
    local_570 = local_6a0;
    uStack_568 = uStack_698;
    local_520 = local_538;
    local_508 = local_538;
    local_4f0 = local_538;
    local_4d8 = local_538;
    local_4c0 = local_538;
    local_4a8 = local_538;
    local_2b0 = local_6b0;
    uStack_2a8 = uStack_6a8;
    uStack_28c = local_290;
    uStack_288 = local_290;
    uStack_284 = local_290;
    uStack_26c = local_270;
    uStack_268 = local_270;
    uStack_264 = local_270;
    uStack_24c = local_250;
    uStack_248 = local_250;
    uStack_244 = local_250;
    uStack_22c = local_230;
    uStack_228 = local_230;
    uStack_224 = local_230;
    uStack_20c = local_210;
    uStack_208 = local_210;
    uStack_204 = local_210;
    uStack_1ec = local_1f0;
    uStack_1e8 = local_1f0;
    uStack_1e4 = local_1f0;
    uStack_1cc = local_1d0;
    uStack_1c8 = local_1d0;
    uStack_1c4 = local_1d0;
    uStack_1ac = local_1b0;
    uStack_1a8 = local_1b0;
    uStack_1a4 = local_1b0;
    uStack_18c = local_190;
    uStack_188 = local_190;
    uStack_184 = local_190;
    uStack_16c = local_170;
    uStack_168 = local_170;
    uStack_164 = local_170;
    uStack_14c = local_150;
    uStack_148 = local_150;
    uStack_144 = local_150;
    uStack_12c = local_130;
    uStack_128 = local_130;
    uStack_124 = local_130;
    uStack_10c = local_110;
    uStack_108 = local_110;
    uStack_104 = local_110;
    local_f0 = local_6b0;
    uStack_e8 = uStack_6a8;
    local_a0 = local_6a0;
    uStack_98 = uStack_698;
    local_50 = local_ba0;
    uStack_48 = uStack_b98;
  }
  for (; local_2374 < local_236c; local_2374 = local_2374 + 1) {
    local_22a8 = &local_236d;
    local_22b0 = local_2358;
    local_22b8 = local_2360;
    fVar70 = atan2f(*(float *)*local_2358,*(float *)*local_2360);
    *local_2368 = fVar70;
    local_2358 = (undefined1 (*) [32])(*local_2358 + 4);
    local_2360 = (undefined1 (*) [32])(*local_2360 + 4);
    local_2368 = local_2368 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_no_broadcast(const float* ptr, const float* ptr1, float* outptr, int size)
{
    const Op op;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_p, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_p, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, *ptr1);
        ptr += 1;
        ptr1 += 1;
        outptr += 1;
    }
}